

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

duplicate_param * __thiscall
boost::runtime::specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error>::
operator<<(duplicate_param *__return_storage_ptr__,
          specific_param_error<boost::runtime::duplicate_param,_boost::runtime::init_error> *this,
          char *val)

{
  std::__cxx11::string::append((char *)&(this->super_init_error).super_param_error.msg);
  duplicate_param::duplicate_param(__return_storage_ptr__,(duplicate_param *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }